

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_count_gt.cpp
# Opt level: O2

void __thiscall IsingFreeEnergy_SquareCount0_Test::TestBody(IsingFreeEnergy_SquareCount0_Test *this)

{
  double Jx;
  double Jy;
  get_type_at<fvar<fvar<double,_2UL>,_2UL>,_sizeof___(Orders)> gVar1;
  get_type_at<fvar<fvar<double,_2UL>,_2UL>,_sizeof___(Orders)> gVar2;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar3;
  root_type rhs_value;
  fvar<double,_2UL> beta;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> f_00;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> h;
  fvar<double,_2UL> beta_00;
  undefined7 uVar4;
  uint in_ECX;
  long lVar5;
  long lVar6;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  *ppVar7;
  AssertionResult *pAVar8;
  double *pdVar9;
  AssertionResult *pAVar10;
  char *pcVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  array<double,_3UL> in_stack_fffffffffffffe18;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  f;
  
  bVar12 = 0;
  Jx = convert<double>("1.5");
  Jy = convert<double>("2.5");
  dVar13 = convert<double>("2");
  dVar13 = 1.0 / dVar13;
  uVar19 = 0;
  uVar17 = 0;
  uVar18 = 0x3ff0000000000000;
  uVar16 = 0;
  uVar15 = 0x3ff0000000000000;
  beta.v._M_elems[1] = 1.0;
  beta.v._M_elems[0] = dVar13;
  beta.v._M_elems[2] = 0.0;
  h.v._M_elems[0].v._M_elems[2] = 0.0;
  h.v._M_elems[0].v._M_elems[0] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,0);
  h.v._M_elems[0].v._M_elems[1] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,8);
  dVar14 = dVar13;
  ising::free_energy::square::
  finite_count<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (&f,(square *)0x4,4,in_ECX,Jx,Jy,beta,h);
  ppVar7 = &f;
  pAVar8 = &gtest_ar_2;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(double *)pAVar8 = (ppVar7->v)._M_elems[0].v._M_elems[0];
    ppVar7 = (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
              *)((long)ppVar7 + ((ulong)bVar12 * -2 + 1) * 8);
    pAVar8 = (AssertionResult *)&pAVar8[-(ulong)bVar12].message_;
  }
  gVar1 = boost::math::differentiation::autodiff_v1::detail::
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::
          derivative<int,int>((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                               *)&gtest_ar_2,0,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"-4.087359662653047e+00","free_energy(f, beta, h)",
             -4.087359662653047,gVar1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x27,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ppVar7 = &f;
  pAVar8 = &gtest_ar_2;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(double *)pAVar8 = (ppVar7->v)._M_elems[0].v._M_elems[0];
    ppVar7 = (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
              *)((long)ppVar7 + ((ulong)bVar12 * -2 + 1) * 8);
    pAVar8 = (AssertionResult *)&pAVar8[-(ulong)bVar12].message_;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  gtest_ar._0_8_ = dVar13;
  gVar1 = boost::math::differentiation::autodiff_v1::detail::
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::
          derivative<int,int>((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                               *)&gtest_ar_2,0,0);
  gVar2 = boost::math::differentiation::autodiff_v1::detail::
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::
          derivative<int,int>((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                               *)&gtest_ar_2,1,0);
  gVar3 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    ((fvar<double,_2UL> *)&gtest_ar,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_1,"-3.994108759068211e+00","energy(f, beta, h)",
             -3.994108759068211,gVar2 * gVar3 + gVar1);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x28,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  ppVar7 = &f;
  pdVar9 = (double *)&stack0xfffffffffffffde8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar9 = (ppVar7->v)._M_elems[0].v._M_elems[0];
    ppVar7 = (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
              *)((long)ppVar7 + ((ulong)bVar12 * -2 + 1) * 8);
    pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
  }
  f_00.v._M_elems[0].v._M_elems[1] = (double)uVar15;
  f_00.v._M_elems[0].v._M_elems[0] = dVar14;
  f_00.v._M_elems[0].v._M_elems[2] = (double)uVar16;
  f_00.v._M_elems[1].v._M_elems[0] = (double)uVar17;
  f_00.v._M_elems[1].v._M_elems[1] = (double)uVar18;
  f_00.v._M_elems[1].v._M_elems[2] = (double)uVar19;
  f_00.v._M_elems[2].v._M_elems =
       (array<double,_3UL>)(array<double,_3UL>)in_stack_fffffffffffffe18._M_elems;
  beta_00.v._M_elems[1] = 1.0;
  beta_00.v._M_elems[0] = dVar13;
  beta_00.v._M_elems[2] = 0.0;
  rhs_value = ising::free_energy::
              specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
                        (f_00,beta_00,
                         (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>
                          )(ZEXT824(0x3ff0000000000000) << 0x40));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_2,"2.452622208849045e-02","specific_heat(f, beta, h)",
             0.02452622208849045,rhs_value);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x29,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  lVar5 = 9;
  ppVar7 = &f;
  pAVar8 = &gtest_ar;
  for (lVar6 = lVar5; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(double *)pAVar8 = (ppVar7->v)._M_elems[0].v._M_elems[0];
    ppVar7 = (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
              *)((long)ppVar7 + ((ulong)bVar12 * -2 + 1) * 8);
    pAVar8 = (AssertionResult *)&pAVar8[-(ulong)bVar12].message_;
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  gtest_ar_1._0_8_ = dVar13;
  gVar3 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    ((fvar<double,_2UL> *)&gtest_ar_1,0);
  pAVar8 = &gtest_ar;
  pAVar10 = &gtest_ar_2;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar4 = *(undefined7 *)&pAVar8->field_0x1;
    pAVar10->success_ = pAVar8->success_;
    *(undefined7 *)&pAVar10->field_0x1 = uVar4;
    pAVar8 = (AssertionResult *)&pAVar8[-(ulong)bVar12].message_;
    pAVar10 = (AssertionResult *)&pAVar10[-(ulong)bVar12].message_;
  }
  gVar1 = boost::math::differentiation::autodiff_v1::detail::
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::
          derivative<int,int>((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                               *)&gtest_ar_2,0,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_3,"1.597700713244840e+01","magnetization2(f, beta, h)",
             15.9770071324484,-gVar1 / gVar3);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x2a,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  return;
}

Assistant:

TEST(IsingFreeEnergy, SquareCount0) {
  typedef double real_t;
  unsigned Lx = 4;
  unsigned Ly = 4;
  auto Jx = convert<real_t>("1.5");
  auto Jy = convert<real_t>("2.5");
  auto t = convert<real_t>("2");
  auto vars = boost::math::differentiation::make_ftuple<real_t, 2, 2>(1 / t, 0);
  auto& beta = std::get<0>(vars);
  auto& h = std::get<1>(vars);
  auto f = square::finite_count(Lx, Ly, Jx, Jy, beta, h);
  EXPECT_DOUBLE_EQ(-4.087359662653047e+00, free_energy(f, beta, h));
  EXPECT_DOUBLE_EQ(-3.994108759068211e+00, energy(f, beta, h));
  EXPECT_DOUBLE_EQ(2.452622208849045e-02, specific_heat(f, beta, h));
  EXPECT_DOUBLE_EQ(1.597700713244840e+01, magnetization2(f, beta, h));
}